

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O1

void joypad_append(JoypadBuffer *buffer,JoypadButtons *buttons,Ticks ticks)

{
  JoypadChunk *pJVar1;
  size_t sVar2;
  Bool BVar3;
  Bool BVar4;
  Bool BVar5;
  Bool BVar6;
  Bool BVar7;
  Bool BVar8;
  Bool BVar9;
  u8 uVar10;
  JoypadChunk *pJVar11;
  JoypadState *pJVar12;
  
  pJVar1 = (buffer->sentinel).prev;
  pJVar11 = pJVar1;
  if (pJVar1->capacity <= pJVar1->size) {
    pJVar11 = (JoypadChunk *)calloc(1,0x28);
    pJVar12 = (JoypadState *)calloc(1,0x10000);
    pJVar11->data = pJVar12;
    pJVar11->capacity = 0x1000;
    pJVar11->next = &buffer->sentinel;
    pJVar11->prev = pJVar1;
    pJVar1->next = pJVar11;
    (buffer->sentinel).prev = pJVar11;
  }
  pJVar12 = pJVar11->data;
  sVar2 = pJVar11->size;
  pJVar11->size = sVar2 + 1;
  pJVar12[sVar2].ticks = ticks;
  uVar10 = joypad_pack_buttons(buttons);
  pJVar12[sVar2].buttons = uVar10;
  BVar3 = buttons->up;
  BVar4 = buttons->left;
  BVar5 = buttons->right;
  BVar6 = buttons->start;
  BVar7 = buttons->select;
  BVar8 = buttons->B;
  BVar9 = buttons->A;
  (buffer->last_buttons).down = buttons->down;
  (buffer->last_buttons).up = BVar3;
  (buffer->last_buttons).left = BVar4;
  (buffer->last_buttons).right = BVar5;
  (buffer->last_buttons).start = BVar6;
  (buffer->last_buttons).select = BVar7;
  (buffer->last_buttons).B = BVar8;
  (buffer->last_buttons).A = BVar9;
  return;
}

Assistant:

void joypad_append(JoypadBuffer* buffer, JoypadButtons* buttons, Ticks ticks) {
  JoypadState* state = alloc_joypad_state(buffer);
  state->ticks = ticks;
  state->buttons = joypad_pack_buttons(buttons);
  buffer->last_buttons = *buttons;
}